

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dmabuf.cpp
# Opt level: O2

MPP_RET mpp_dmabuf_sync_partial_end(RK_S32 fd,RK_S32 ro,RK_U32 offset,RK_U32 length,char *caller)

{
  int iVar1;
  MPP_RET MVar2;
  int *piVar3;
  char *pcVar4;
  dma_buf_sync_partial sync;
  
  if (has_partial_ops != 0) {
    if (length == 0) {
      return MPP_OK;
    }
    sync.flags = (ulong)(ro == 0) * 2 + 5;
    sync.offset = offset & 0xffffffc0;
    sync.len = ((length + offset) - sync.offset) + 0x3f & 0xffffffc0;
    iVar1 = ioctl(fd,0x40106202,&sync);
    if (iVar1 == 0) {
      return MPP_OK;
    }
    piVar3 = __errno_location();
    if (*piVar3 != 0x19) {
      pcVar4 = strerror(*piVar3);
      _mpp_log_l(2,(char *)0x0,"ioctl failed for %s from %s\n","mpp_dmabuf_sync_partial_end",pcVar4,
                 caller);
      return MPP_NOK;
    }
    has_partial_ops = 0;
  }
  MVar2 = mpp_dmabuf_sync_end(fd,ro,caller);
  return MVar2;
}

Assistant:

MPP_RET mpp_dmabuf_sync_partial_end(RK_S32 fd, RK_S32 ro, RK_U32 offset, RK_U32 length, const char *caller)
{
    if (has_partial_ops) {
        struct dma_buf_sync_partial sync;
        RK_S32 ret;

        if (!length)
            return MPP_OK;

        sync.flags = DMA_BUF_SYNC_END | (ro ? DMA_BUF_SYNC_READ : DMA_BUF_SYNC_RW);
        sync.offset = MPP_ALIGN_DOWN(offset, CACHE_LINE_SIZE);
        sync.len = MPP_ALIGN(length + offset - sync.offset, CACHE_LINE_SIZE);

        ret = ioctl(fd, DMA_BUF_IOCTL_SYNC_PARTIAL, &sync);
        if (ret) {
            if (errno == MPP_NO_PARTIAL_SUPPORT) {
                has_partial_ops = 0;
                goto NOT_SUPPORT;
            }

            mpp_err_f("ioctl failed for %s from %s\n", strerror(errno), caller);
            return MPP_NOK;
        }

        return MPP_OK;
    }

NOT_SUPPORT:
    return mpp_dmabuf_sync_end(fd, ro, caller);
}